

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError ContinuePoll(PaAlsaStream *stream,StreamDirection streamDir,int *pollTimeout,
                    int *continuePoll)

{
  int iVar1;
  int iVar2;
  pthread_t __thread1;
  char *errorText;
  ulong frames;
  PaAlsaStreamComponent *pPStack_58;
  int __pa_unsure_error_id;
  PaAlsaStreamComponent *otherComponent;
  PaAlsaStreamComponent *component;
  int err;
  snd_pcm_sframes_t margin;
  snd_pcm_sframes_t delay;
  int *piStack_28;
  PaError result;
  int *continuePoll_local;
  int *pollTimeout_local;
  PaAlsaStream *pPStack_10;
  StreamDirection streamDir_local;
  PaAlsaStream *stream_local;
  
  delay._4_4_ = 0;
  *continuePoll = 1;
  if (streamDir == StreamDirection_In) {
    pPStack_58 = &stream->playback;
  }
  else {
    pPStack_58 = &stream->capture;
  }
  piStack_28 = continuePoll;
  continuePoll_local = pollTimeout;
  pollTimeout_local._4_4_ = streamDir;
  pPStack_10 = stream;
  iVar1 = (*alsa_snd_pcm_delay)(pPStack_58->pcm,&margin);
  if (iVar1 < 0) {
    if (iVar1 == -0x20) {
      *piStack_28 = 0;
      return delay._4_4_;
    }
    if (iVar1 < 0) {
      __thread1 = pthread_self();
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar2 != 0) {
        errorText = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
      }
      PaUtil_DebugPrint(
                       "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3350\n"
                       );
      return -9999;
    }
  }
  if (pollTimeout_local._4_4_ == StreamDirection_Out) {
    margin = pPStack_58->alsaBufferSize - margin;
  }
  frames = margin - (pPStack_58->framesPerPeriod >> 1);
  if ((long)frames < 0) {
    *piStack_28 = 0;
  }
  else if (frames < pPStack_58->framesPerPeriod) {
    iVar1 = CalculatePollTimeout(pPStack_10,frames);
    *continuePoll_local = iVar1;
  }
  return delay._4_4_;
}

Assistant:

static PaError ContinuePoll( const PaAlsaStream *stream, StreamDirection streamDir, int *pollTimeout, int *continuePoll )
{
    PaError result = paNoError;
    snd_pcm_sframes_t delay, margin;
    int err;
    const PaAlsaStreamComponent *component = NULL, *otherComponent = NULL;

    *continuePoll = 1;

    if( StreamDirection_In == streamDir )
    {
        component = &stream->capture;
        otherComponent = &stream->playback;
    }
    else
    {
        component = &stream->playback;
        otherComponent = &stream->capture;
    }

    /* ALSA docs say that negative delay should indicate xrun, but in my experience alsa_snd_pcm_delay returns -EPIPE */
    if( ( err = alsa_snd_pcm_delay( otherComponent->pcm, &delay ) ) < 0 )
    {
        if( err == -EPIPE )
        {
            /* Xrun */
            *continuePoll = 0;
            goto error;
        }

        ENSURE_( err, paUnanticipatedHostError );
    }

    if( StreamDirection_Out == streamDir )
    {
        /* Number of eligible frames before capture overrun */
        delay = otherComponent->alsaBufferSize - delay;
    }
    margin = delay - otherComponent->framesPerPeriod / 2;

    if( margin < 0 )
    {
        PA_DEBUG(( "%s: Stopping poll for %s\n", __FUNCTION__, StreamDirection_In == streamDir ? "capture" : "playback" ));
        *continuePoll = 0;
    }
    else if( margin < otherComponent->framesPerPeriod )
    {
        *pollTimeout = CalculatePollTimeout( stream, margin );
        PA_DEBUG(( "%s: Trying to poll again for %s frames, pollTimeout: %d\n",
                    __FUNCTION__, StreamDirection_In == streamDir ? "capture" : "playback", *pollTimeout ));
    }

error:
    return result;
}